

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

int __thiscall Mat::countNe(Mat *this,ll128 *b)

{
  int iVar1;
  long lVar2;
  pointer p_Var3;
  pointer p_Var4;
  long lVar5;
  ulong uVar6;
  
  lVar2 = (long)this->r;
  if (0 < lVar2) {
    p_Var4 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar1 = 0;
    do {
      p_Var3 = p_Var4;
      uVar6 = (ulong)(uint)this->c;
      if (0 < this->c) {
        do {
          iVar1 = iVar1 + (uint)(*(long *)((long)p_Var3 + 8) != *(long *)((long)b + 8) ||
                                (long)*p_Var3 != (long)*b);
          p_Var3 = p_Var3 + lVar2;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      lVar5 = lVar5 + 1;
      p_Var4 = p_Var4 + 1;
    } while (lVar5 != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Mat::countNe(const ll128 &b) const {
    int ret = 0;
    for (int i = 0; i < r; i++)
        for (int j = 0; j < c; j++)
            if (get(i, j) != b)
                ret++;
    return ret;
}